

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11_meta_dealloc(PyObject *obj)

{
  anon_class_8_1_ba1d6857 local_18;
  PyObject *local_10;
  PyObject *obj_local;
  
  local_18.obj = obj;
  local_10 = obj;
  pybind11::detail::with_internals<pybind11_meta_dealloc::_lambda(pybind11::detail::internals&)_1_>
            (&local_18);
  (*__string)(local_10);
  return;
}

Assistant:

inline void pybind11_meta_dealloc(PyObject *obj) {
    with_internals([obj](internals &internals) {
        auto *type = (PyTypeObject *) obj;

        // A pybind11-registered type will:
        // 1) be found in internals.registered_types_py
        // 2) have exactly one associated `detail::type_info`
        auto found_type = internals.registered_types_py.find(type);
        if (found_type != internals.registered_types_py.end() && found_type->second.size() == 1
            && found_type->second[0]->type == type) {

            auto *tinfo = found_type->second[0];
            auto tindex = std::type_index(*tinfo->cpptype);
            internals.direct_conversions.erase(tindex);

            if (tinfo->module_local) {
                get_local_internals().registered_types_cpp.erase(tindex);
            } else {
                internals.registered_types_cpp.erase(tindex);
            }
            internals.registered_types_py.erase(tinfo->type);

            // Actually just `std::erase_if`, but that's only available in C++20
            auto &cache = internals.inactive_override_cache;
            for (auto it = cache.begin(), last = cache.end(); it != last;) {
                if (it->first == (PyObject *) tinfo->type) {
                    it = cache.erase(it);
                } else {
                    ++it;
                }
            }

            delete tinfo;
        }
    });

    PyType_Type.tp_dealloc(obj);
}